

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdAddSighashTypeInSchnorrSignature
              (void *handle,char *signature,int sighash_type,bool anyone_can_pay,
              char **added_signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  SchnorrSignature sig;
  string local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  SigHashType sighash_type_obj;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x2c7;
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddSighashTypeInSchnorrSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)&sig,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sig,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_70);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&sig);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (added_signature != (char **)0x0) {
    std::__cxx11::string::string((string *)&local_70,signature,(allocator *)&local_50);
    cfd::core::SchnorrSignature::SchnorrSignature(&sig,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cfd::core::SigHashType::Create(&sighash_type_obj,(uint8_t)sighash_type,anyone_can_pay,false);
    cfd::core::SchnorrSignature::SetSigHashType(&sig,&sighash_type_obj);
    cfd::core::SchnorrSignature::GetData((ByteData *)&local_50,&sig,true);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_70,(ByteData *)&local_50);
    pcVar2 = cfd::capi::CreateString(&local_70);
    *added_signature = pcVar2;
    std::__cxx11::string::~string((string *)&local_70);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
    return 0;
  }
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x2cd;
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdAddSighashTypeInSchnorrSignature";
  cfd::core::logger::warn<>((CfdSourceLocation *)&sig,"added_signature is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&sig,"Failed to parameter. added_signature is null or empty.",
             (allocator *)&local_70);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&sig);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddSighashTypeInSchnorrSignature(
    void* handle, const char* signature, int sighash_type, bool anyone_can_pay,
    char** added_signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (added_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "added_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. added_signature is null or empty.");
    }
    SchnorrSignature sig(signature);
    SigHashType sighash_type_obj = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), anyone_can_pay);
    sig.SetSigHashType(sighash_type_obj);
    *added_signature = CreateString(sig.GetData(true).GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}